

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O2

int __thiscall svm_example::compute_kernels(svm_example *this,svm_params *params)

{
  ulong uVar1;
  int iVar2;
  size_t i;
  ulong uVar3;
  float kv;
  float local_3c;
  svm_model *local_38;
  
  local_38 = params->model;
  uVar1 = local_38->num_support;
  uVar3 = (long)(this->krow)._end - (long)(this->krow)._begin >> 2;
  if (uVar3 < uVar1) {
    num_kernel_evals = num_kernel_evals + uVar3;
    iVar2 = 0;
    for (; uVar3 < uVar1; uVar3 = uVar3 + 1) {
      local_3c = kernel_function(&this->ex,&(local_38->support_vec)._begin[uVar3]->ex,
                                 params->kernel_params,params->kernel_type);
      v_array<float>::push_back(&this->krow,&local_3c);
      iVar2 = iVar2 + 1;
    }
  }
  else {
    num_cache_evals = num_cache_evals + uVar1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int svm_example::compute_kernels(svm_params& params)
{
  int alloc = 0;
  svm_model* model = params.model;
  size_t n = model->num_support;

  if (krow.size() < n)
  {
    // computing new kernel values and caching them
    // if(params->curcache + n > params->maxcache)
    // trim_cache(params);
    num_kernel_evals += krow.size();
    // cerr<<"Kernels ";
    for (size_t i = krow.size(); i < n; i++)
    {
      svm_example* sec = model->support_vec[i];
      float kv = kernel_function(&ex, &(sec->ex), params.kernel_params, params.kernel_type);
      krow.push_back(kv);
      alloc += 1;
      // cerr<<kv<<" ";
    }
    // cerr<<endl;
  }
  else
    num_cache_evals += n;
  return alloc;
}